

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O3

EulerAngles *
AML::quat2EulerAngles(EulerAngles *__return_storage_ptr__,Quaternion *quat,EulerSequence seq)

{
  if (0.0002 <= ABS(SQRT((quat->field_0).data[3] * (quat->field_0).data[3] +
                         (quat->field_0).data[2] * (quat->field_0).data[2] +
                         (quat->field_0).data[0] * (quat->field_0).data[0] +
                         (quat->field_0).data[1] * (quat->field_0).data[1]) + -1.0)) {
switchD_0010630f_default:
    EulerAngles::EulerAngles(__return_storage_ptr__);
  }
  else {
    switch(seq) {
    case ZXZ:
      quat2EulerAngles_ZXZ(__return_storage_ptr__,quat);
      break;
    case XYX:
      quat2EulerAngles_XYX(__return_storage_ptr__,quat);
      break;
    case YZY:
      quat2EulerAngles_YZY(__return_storage_ptr__,quat);
      break;
    case ZYZ:
      quat2EulerAngles_ZYZ(__return_storage_ptr__,quat);
      break;
    case XZX:
      quat2EulerAngles_XZX(__return_storage_ptr__,quat);
      break;
    case YXY:
      quat2EulerAngles_YXY(__return_storage_ptr__,quat);
      break;
    case XYZ:
      quat2EulerAngles_XYZ(__return_storage_ptr__,quat);
      break;
    case YZX:
      quat2EulerAngles_YZX(__return_storage_ptr__,quat);
      break;
    case ZXY:
      quat2EulerAngles_ZXY(__return_storage_ptr__,quat);
      break;
    case XZY:
      quat2EulerAngles_XZY(__return_storage_ptr__,quat);
      break;
    case ZYX:
      quat2EulerAngles_ZYX(__return_storage_ptr__,quat);
      break;
    case YXZ:
      quat2EulerAngles_YXZ(__return_storage_ptr__,quat);
      break;
    default:
      goto switchD_0010630f_default;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

double norm(const Quaternion& rhs)
    {
        return sqrt(rhs.q0 * rhs.q0 + rhs.q1 * rhs.q1 + rhs.q2 * rhs.q2 + rhs.q3 * rhs.q3);
    }